

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall
QWidgetPrivate::paintBackground
          (QWidgetPrivate *this,QPainter *painter,QRegion *rgn,DrawWidgetFlags flags)

{
  long lVar1;
  QWidget *this_00;
  char cVar2;
  bool bVar3;
  ColorRole cr;
  QPalette *pQVar4;
  QBrush *pQVar5;
  long lVar6;
  QStyle *pQVar7;
  long in_FS_OFFSET;
  QBrush autoFillBrush;
  QBrush bg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  _autoFillBrush = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = QWidget::palette(this_00);
  cr = QWidget::backgroundRole(this_00);
  pQVar5 = QPalette::brush(pQVar4,cr);
  QBrush::QBrush(&autoFillBrush,pQVar5);
  if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
             super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) == 0) {
LAB_002f4206:
    bVar3 = false;
  }
  else {
    lVar6 = *(long *)(*(long *)&this_00->field_0x8 + 0x78);
    if ((lVar6 != 0) && ((*(byte *)(lVar6 + 0x7c) & 0x10) != 0)) {
      cVar2 = QBrush::isOpaque();
      if (cVar2 != '\0') goto LAB_002f4206;
    }
    _bg = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QWidget::palette(this_00);
    pQVar5 = QPalette::brush(pQVar4,Window);
    QBrush::QBrush(&bg,pQVar5);
    bVar3 = updateBrushOrigin(this,painter,&bg);
    if ((char)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
              super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i < '\0') {
      fillRegion(painter,rgn,&bg);
    }
    else {
      QPainter::compositionMode();
      QPainter::setCompositionMode((CompositionMode)painter);
      fillRegion(painter,rgn,&bg);
      QPainter::setCompositionMode((CompositionMode)painter);
    }
    QBrush::~QBrush(&bg);
  }
  lVar6 = *(long *)&this_00->field_0x8;
  if ((*(long *)(lVar6 + 0x78) != 0) && ((*(byte *)(*(long *)(lVar6 + 0x78) + 0x7c) & 0x10) != 0)) {
    if (bVar3 == false) {
      updateBrushOrigin(this,painter,&autoFillBrush);
    }
    fillRegion(painter,rgn,&autoFillBrush);
    lVar6 = *(long *)&this_00->field_0x8;
  }
  if ((*(byte *)(lVar6 + 0x247) & 0x20) != 0) {
    QPainter::setClipRegion((QRegion *)painter,(ClipOperation)rgn);
    _bg = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)&bg,1,0);
    QStyleOption::initFrom((QStyleOption *)&bg,this_00);
    pQVar7 = QWidget::style(this_00);
    (**(code **)(*(long *)pQVar7 + 0xb0))(pQVar7,0x29,(QStyleOption *)&bg,painter,this_00);
    QStyleOption::~QStyleOption((QStyleOption *)&bg);
  }
  QBrush::~QBrush(&autoFillBrush);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::paintBackground(QPainter *painter, const QRegion &rgn, DrawWidgetFlags flags) const
{
    Q_Q(const QWidget);

    bool brushOriginSet = false;
    const QBrush autoFillBrush = q->palette().brush(q->backgroundRole());

    if ((flags & DrawAsRoot) && !(q->autoFillBackground() && autoFillBrush.isOpaque())) {
        const QBrush bg = q->palette().brush(QPalette::Window);
        if (!brushOriginSet)
            brushOriginSet = updateBrushOrigin(painter, bg);
        if (!(flags & DontSetCompositionMode)) {
            //copy alpha straight in
            QPainter::CompositionMode oldMode = painter->compositionMode();
            painter->setCompositionMode(QPainter::CompositionMode_Source);
            fillRegion(painter, rgn, bg);
            painter->setCompositionMode(oldMode);
        } else {
            fillRegion(painter, rgn, bg);
        }
    }

    if (q->autoFillBackground()) {
        if (!brushOriginSet)
            brushOriginSet = updateBrushOrigin(painter, autoFillBrush);
        fillRegion(painter, rgn, autoFillBrush);
    }

    if (q->testAttribute(Qt::WA_StyledBackground)) {
        painter->setClipRegion(rgn);
        QStyleOption opt;
        opt.initFrom(q);
        q->style()->drawPrimitive(QStyle::PE_Widget, &opt, painter, q);
    }
}